

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::get(basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
      *this,size_type index)

{
  format_arg *in_RDI;
  format_arg *arg;
  longlong local_38;
  named_arg_base<char> *in_stack_ffffffffffffffd0;
  type local_28;
  size_type in_stack_ffffffffffffffdc;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffffe0;
  
  do_get(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (in_RDI->type_ == named_arg_type) {
    internal::
    value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    ::as_named_arg(&in_RDI->value_);
    internal::named_arg_base<char>::
    deserialize<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
              (in_stack_ffffffffffffffd0);
    (in_RDI->value_).field_0.long_long_value = local_38;
    (in_RDI->value_).field_0.custom.format =
         (_func_void_void_ptr_basic_format_context<fmt::v5::internal::truncating_iterator<char_ptr,_std::integral_constant<bool,_false>_>,_char>_ptr
          *)in_stack_ffffffffffffffd0;
    in_RDI->type_ = local_28;
  }
  return in_RDI;
}

Assistant:

format_arg get(size_type index) const {
    format_arg arg = do_get(index);
    if (arg.type_ == internal::named_arg_type)
      arg = arg.value_.as_named_arg().template deserialize<Context>();
    return arg;
  }